

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanTarget(Cleaner *this,Node *target)

{
  if (target != (Node *)0x0) {
    Reset(this);
    PrintHeader(this);
    LoadDyndeps(this);
    DoCleanTarget(this,target);
    PrintFooter(this);
    return this->status_;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean.cc",
                0xab,"int Cleaner::CleanTarget(Node *)");
}

Assistant:

int Cleaner::CleanTarget(Node* target) {
  assert(target);

  Reset();
  PrintHeader();
  LoadDyndeps();
  DoCleanTarget(target);
  PrintFooter();
  return status_;
}